

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::Generate
          (ImmutableServiceGenerator *this,Printer *printer)

{
  char cVar1;
  ServiceDescriptor *pSVar2;
  Context *context;
  long lVar3;
  char *__s;
  string local_70;
  string local_50;
  
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  cVar1 = *(char *)(*(long *)(*(long *)(pSVar2 + 0x10) + 0xa0) + 0xa0);
  WriteServiceDocComment(printer,pSVar2);
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)&local_50);
  MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
            (context,printer,pSVar2,true,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  __s = "static";
  if (cVar1 != '\0') {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,__s,(allocator<char> *)&local_50);
  io::Printer::Print(printer,
                     "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n"
                     ,"static",&local_70,"classname",
                     *(string **)(this->super_ServiceGenerator).descriptor_);
  std::__cxx11::string::~string((string *)&local_70);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"protected $classname$() {}\n\n","classname",
                     *(string **)(this->super_ServiceGenerator).descriptor_);
  GenerateInterface(this,printer);
  GenerateNewReflectiveServiceMethod(this,printer);
  GenerateNewReflectiveBlockingServiceMethod(this,printer);
  GenerateAbstractMethods(this,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_70,this->name_resolver_,
             *(FileDescriptor **)((this->super_ServiceGenerator).descriptor_ + 0x10));
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  lVar3 = (long)pSVar2 - *(long *)(*(long *)(pSVar2 + 0x10) + 0x80);
  SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(lVar3 / 0x30 & 0xffffffff),(int)(lVar3 % 0x30));
  io::Printer::Print(printer,
                     "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
                     ,"file",&local_70,"index",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  io::Printer::Print(printer,
                     "public final com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\n"
                    );
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  GenerateStub(this,printer);
  GenerateBlockingStub(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)((this->super_ServiceGenerator).descriptor_ + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);
  WriteServiceDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  printer->Print(
    "public $static$ abstract class $classname$\n"
    "    implements com.google.protobuf.Service {\n",
    "static", is_own_file ? "" : "static",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "protected $classname$() {}\n\n",
    "classname", descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
    "public static final\n"
    "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
    "    getDescriptor() {\n"
    "  return $file$.getDescriptor().getServices().get($index$);\n"
    "}\n",
    "file", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "index", SimpleItoa(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}